

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O1

ItemThing * leave_pack(ItemThing *obj,bool newobj,bool all)

{
  int iVar1;
  long lVar2;
  ItemThing *pIVar3;
  byte bVar4;
  ItemThing *local_18;
  
  bVar4 = 0;
  local_18 = obj;
  if (obj->count < 2 || all) {
    last_pick = (ItemThing *)0x0;
    *(undefined1 *)((long)&fire_bolt::spotpos[1].y + (long)obj->packch + 3) = 0;
    std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::remove
              (&player.pack,(char *)&local_18);
  }
  else {
    last_pick = obj;
    obj->count = obj->count + -1;
    if (newobj) {
      obj = (ItemThing *)operator_new(0x48);
      ItemThing::ItemThing(obj);
      pIVar3 = obj;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        iVar1 = (local_18->pos).x;
        pIVar3->type = local_18->type;
        (pIVar3->pos).x = iVar1;
        local_18 = (ItemThing *)((long)local_18 + (ulong)bVar4 * -0x10 + 8);
        pIVar3 = (ItemThing *)((long)pIVar3 + (ulong)bVar4 * -0x10 + 8);
      }
      obj->count = 1;
    }
  }
  return obj;
}

Assistant:

ItemThing * leave_pack(ItemThing *obj, bool newobj, bool all)
{
    ItemThing *nobj;

    nobj = obj;
    if (obj->count > 1 && !all)
    {
        last_pick = obj;
        obj->count--;
        if (newobj)
        {
            nobj = new ItemThing();
            *nobj = *obj;
            nobj->count = 1;
        }
    }
    else
    {
        last_pick = nullptr;
        pack_used[obj->packch - 'a'] = false;
        player.pack.remove(obj);
    }
    return nobj;
}